

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O0

void rand_bytes(byte *pb,size_t cb)

{
  undefined1 local_1b8 [8];
  mbedtls_ctr_drbg_context ctrDrbg;
  mbedtls_entropy_context entropy;
  size_t cb_local;
  byte *pb_local;
  
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctrDrbg.p_entropy);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)local_1b8);
  mbedtls_ctr_drbg_seed
            ((mbedtls_ctr_drbg_context *)local_1b8,mbedtls_entropy_func,&ctrDrbg.p_entropy,
             nonce_pers_pr,0x10);
  mbedtls_ctr_drbg_random(local_1b8,pb,cb);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)local_1b8);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctrDrbg.p_entropy);
  return;
}

Assistant:

void rand_bytes(byte* pb, size_t cb) {
    mbedtls_entropy_context  entropy;
	mbedtls_ctr_drbg_context ctrDrbg;

	mbedtls_entropy_init(&entropy);
    mbedtls_ctr_drbg_init(&ctrDrbg);
    mbedtls_ctr_drbg_seed(&ctrDrbg, mbedtls_entropy_func, &entropy, nonce_pers_pr, sizeof(nonce_pers_pr));
    
	mbedtls_ctr_drbg_random(&ctrDrbg, pb, cb);

	mbedtls_ctr_drbg_free(&ctrDrbg);
    mbedtls_entropy_free(&entropy);
}